

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

ostream * miniros::operator<<(ostream *os,SteadyTime *rhs)

{
  long lVar1;
  ostream *poVar2;
  ostream *poVar3;
  IosFlagSaver s;
  IosFlagSaver IStack_48;
  
  IosFlagSaver::IosFlagSaver(&IStack_48,os);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 9;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar3 = poVar2 + lVar1;
  if (poVar2[lVar1 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x30;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  IosFlagSaver::restore(&IStack_48);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream& os, const SteadyTime &rhs)
  {
	IosFlagSaver s(os);
    os << rhs.sec << "." << std::setw(9) << std::setfill('0') << rhs.nsec;
    return os;
  }